

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O1

Error __thiscall asmjit::v1_14::BaseRAPass::updateStackFrame(BaseRAPass *this)

{
  uint *puVar1;
  byte bVar2;
  uint32_t offset;
  FuncNode *pFVar3;
  Iterator __begin2;
  byte bVar4;
  Error EVar5;
  long lVar6;
  byte bVar7;
  
  pFVar3 = this->_func;
  lVar6 = 0;
  do {
    puVar1 = (pFVar3->_frame)._dirtyRegs._data + lVar6;
    *puVar1 = *puVar1 | (this->_clobberedRegs)._masks._data[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  bVar4 = (byte)*(undefined4 *)&this->field_0x208;
  (pFVar3->_frame)._localStackAlignment = bVar4;
  bVar2 = (pFVar3->_frame)._naturalStackAlignment;
  bVar7 = (pFVar3->_frame)._callStackAlignment;
  if (bVar7 < bVar2) {
    bVar7 = bVar2;
  }
  if (bVar7 <= bVar4) {
    bVar7 = bVar4;
  }
  (pFVar3->_frame)._finalStackAlignment = bVar7;
  if ((this->_numStackArgsToStackSlots == 0) || (EVar5 = _markStackArgsToKeep(this), EVar5 == 0)) {
    EVar5 = RAStackAllocator::calculateStackFrame(&this->_stackAllocator);
    if (EVar5 == 0) {
      (pFVar3->_frame)._localStackSize = *(uint32_t *)&this->field_0x204;
      EVar5 = FuncArgsAssignment::updateFuncFrame(&this->_argsAssignment,&pFVar3->_frame);
      if ((((EVar5 == 0) && (EVar5 = FuncFrame::finalize(&pFVar3->_frame), EVar5 == 0)) &&
          ((offset = (pFVar3->_frame)._localStackOffset, offset == 0 ||
           (EVar5 = RAStackAllocator::adjustSlotOffsets(&this->_stackAllocator,offset), EVar5 == 0))
          )) && ((this->_numStackArgsToStackSlots == 0 ||
                 (EVar5 = _updateStackArgs(this), EVar5 == 0)))) {
        EVar5 = 0;
      }
    }
  }
  return EVar5;
}

Assistant:

Error BaseRAPass::updateStackFrame() noexcept {
  // Update some StackFrame information that we updated during allocation. The only information we don't have at the
  // moment is final local stack size, which is calculated last.
  FuncFrame& frame = func()->frame();
  for (RegGroup group : RegGroupVirtValues{})
    frame.addDirtyRegs(group, _clobberedRegs[group]);
  frame.setLocalStackAlignment(_stackAllocator.alignment());

  // If there are stack arguments that are not assigned to registers upon entry and the function doesn't require
  // dynamic stack alignment we keep these arguments where they are. This will also mark all stack slots that match
  // these arguments as allocated.
  if (_numStackArgsToStackSlots)
    ASMJIT_PROPAGATE(_markStackArgsToKeep());

  // Calculate offsets of all stack slots and update StackSize to reflect the calculated local stack size.
  ASMJIT_PROPAGATE(_stackAllocator.calculateStackFrame());
  frame.setLocalStackSize(_stackAllocator.stackSize());

  // Update the stack frame based on `_argsAssignment` and finalize it. Finalization means to apply final calculation
  // to the stack layout.
  ASMJIT_PROPAGATE(_argsAssignment.updateFuncFrame(frame));
  ASMJIT_PROPAGATE(frame.finalize());

  // StackAllocator allocates all stots starting from [0], adjust them when necessary.
  if (frame.localStackOffset() != 0)
    ASMJIT_PROPAGATE(_stackAllocator.adjustSlotOffsets(int32_t(frame.localStackOffset())));

  // Again, if there are stack arguments allocated in function's stack we have to handle them. This handles all cases
  // (either regular or dynamic stack alignment).
  if (_numStackArgsToStackSlots)
    ASMJIT_PROPAGATE(_updateStackArgs());

  return kErrorOk;
}